

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ikfast61_kukakr3r540.cpp
# Opt level: O2

void IKSolver::polyroots4(IkReal *rawcoeffs,IkReal *rawroots,int *numroots)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined8 uVar3;
  undefined8 uVar4;
  bool bVar5;
  long lVar6;
  int iVar7;
  double *pdVar8;
  int i;
  long lVar9;
  uint uVar10;
  complex<double> *__x;
  long lVar11;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  IkReal err [4];
  bool visited [4];
  undefined1 auStack_124 [60];
  complex<double> local_e8;
  complex<double> coeffs [4];
  complex<double> roots [4];
  double local_58 [5];
  
  dVar13 = *rawcoeffs;
  if ((dVar13 == 0.0) && (!NAN(dVar13))) {
    polyroots3(rawcoeffs + 1,rawroots,numroots);
    return;
  }
  dVar12 = 0.0;
  coeffs[3]._M_value._0_8_ = 0;
  coeffs[3]._M_value._8_8_ = 0;
  coeffs[2]._M_value._0_8_ = 0;
  coeffs[2]._M_value._8_8_ = 0;
  coeffs[1]._M_value._0_8_ = 0;
  coeffs[1]._M_value._8_8_ = 0;
  coeffs[0]._M_value._0_8_ = 0;
  coeffs[0]._M_value._8_8_ = 0;
  for (lVar6 = 0; lVar6 != 0x20; lVar6 = lVar6 + 8) {
    dVar12 = *(double *)((long)rawcoeffs + lVar6 + 8) / dVar13;
    *(double *)(coeffs[0]._M_value + lVar6 * 2) = dVar12;
    *(undefined8 *)(coeffs[0]._M_value + lVar6 * 2 + 8) = 0;
  }
  roots[3]._M_value._0_8_ = 0;
  roots[3]._M_value._8_8_ = 0;
  roots[2]._M_value._0_8_ = 0;
  roots[2]._M_value._8_8_ = 0;
  roots[0]._M_value._0_8_ = 0x3ff0000000000000;
  roots[0]._M_value._8_8_ = 0;
  roots[1]._M_value._0_8_ = 0x3fd999999999999a;
  roots[1]._M_value._8_8_ = 0x3feccccccccccccd;
  pdVar8 = local_58 + 2;
  local_58[0] = 1.0;
  local_58[1] = 1.0;
  for (lVar6 = 0x10; uVar4 = coeffs[0]._M_value._8_8_, uVar3 = coeffs[0]._M_value._0_8_,
      lVar6 != 0x30; lVar6 = lVar6 + 0x10) {
    std::operator*((complex<double> *)(roots[0]._M_value + lVar6),roots + 1);
    *(ulong *)(roots[1]._M_value + lVar6) = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    *(double *)(roots[1]._M_value + lVar6 + 8) = dVar12;
    *pdVar8 = 1.0;
    pdVar8 = pdVar8 + 1;
  }
  iVar7 = 0;
  do {
    if (iVar7 == 0x6e) break;
    lVar6 = 0;
    bVar5 = false;
    for (lVar9 = 0; dVar13 = 2.842170943040401e-14, lVar9 != 4; lVar9 = lVar9 + 1) {
      if (2.842170943040401e-14 <= local_58[lVar9]) {
        __x = roots + lVar9;
        dVar12 = *(double *)(roots[lVar9]._M_value + 8) + (double)uVar4;
        unique0x100001bd = SUB84(dVar12,0);
        _visited = *(double *)__x->_M_value + (double)uVar3;
        unique0x100001c1 = (int)((ulong)dVar12 >> 0x20);
        for (lVar11 = 0x10; lVar11 != 0x40; lVar11 = lVar11 + 0x10) {
          std::operator*(__x,(complex<double> *)visited);
          dVar12 = dVar13 + *(double *)(coeffs[0]._M_value + lVar11 + 8);
          unique0x100001e1 = SUB84(dVar12,0);
          _visited = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00) +
                     *(double *)(coeffs[0]._M_value + lVar11);
          unique0x100001e5 = (int)((ulong)dVar12 >> 0x20);
        }
        for (lVar11 = 0; lVar11 != 0x40; lVar11 = lVar11 + 0x10) {
          if (lVar6 != lVar11) {
            dVar13 = *(double *)__x->_M_value;
            dVar12 = *(double *)(roots[0]._M_value + lVar11);
            if (((dVar13 != dVar12) || (NAN(dVar13) || NAN(dVar12))) ||
               (*(double *)(roots[lVar9]._M_value + 8) !=
                *(double *)(roots[0]._M_value + lVar11 + 8))) {
              dVar14 = *(double *)(roots[lVar9]._M_value + 8) -
                       *(double *)(roots[0]._M_value + lVar11 + 8);
              local_e8._M_value._8_4_ = SUB84(dVar14,0);
              local_e8._M_value._0_8_ = dVar13 - dVar12;
              local_e8._M_value._12_4_ = (int)((ulong)dVar14 >> 0x20);
              std::complex<double>::operator/=((complex<double> *)visited,&local_e8);
            }
          }
        }
        dVar13 = *(double *)(roots[lVar9]._M_value + 8) - (double)auStack_124._4_8_;
        auVar1._8_4_ = SUB84(dVar13,0);
        auVar1._0_8_ = *(double *)__x->_M_value - _visited;
        auVar1._12_4_ = (int)((ulong)dVar13 >> 0x20);
        *(undefined1 (*) [16])__x->_M_value = auVar1;
        dVar13 = std::abs<double>((complex<double> *)visited);
        local_58[lVar9] = dVar13;
        bVar5 = true;
      }
      lVar6 = lVar6 + 0x10;
    }
    iVar7 = iVar7 + 1;
  } while (bVar5);
  *numroots = 0;
  auVar2._12_4_ = 0;
  auVar2._0_12_ = auStack_124._0_12_;
  _visited = (_ComplexT)(auVar2 << 0x20);
  lVar6 = 0;
  iVar7 = 0;
  while( true ) {
    if (lVar6 == 4) {
      return;
    }
    if (visited[lVar6] == false) break;
LAB_00131d4d:
    lVar6 = lVar6 + 1;
  }
  dVar13 = *(double *)roots[lVar6]._M_value;
  dVar12 = *(double *)(roots[lVar6]._M_value + 8);
  uVar10 = 1;
  lVar9 = lVar6;
  dVar14 = dVar13;
  dVar15 = dVar12;
  do {
    pdVar8 = (double *)(roots[lVar9 + 1]._M_value + 8);
    lVar11 = lVar9;
    while( true ) {
      lVar9 = lVar11 + 1;
      if (lVar9 == 4) {
        if (1 < uVar10) {
          dVar15 = dVar15 / (double)(int)uVar10;
        }
        if (ABS(dVar15) < 1.4901161193847656e-08) {
          if (1 < uVar10) {
            dVar14 = dVar14 / (double)(int)uVar10;
          }
          lVar9 = (long)iVar7;
          iVar7 = iVar7 + 1;
          *numroots = iVar7;
          rawroots[lVar9] = dVar14;
        }
        goto LAB_00131d4d;
      }
      if ((ABS(dVar13 - pdVar8[-1]) < 1.4901161193847656e-08) && (ABS(dVar12 - *pdVar8) < 0.002))
      break;
      pdVar8 = pdVar8 + 2;
      lVar11 = lVar9;
    }
    dVar14 = dVar14 + pdVar8[-1];
    dVar15 = dVar15 + *pdVar8;
    uVar10 = uVar10 + 1;
    visited[lVar11 + 1] = true;
  } while( true );
}

Assistant:

static inline void polyroots4(IkReal rawcoeffs[4+1], IkReal rawroots[4], int& numroots)
{
    using std::complex;
    if( rawcoeffs[0] == 0 ) {
        // solve with one reduced degree
        polyroots3(&rawcoeffs[1], &rawroots[0], numroots);
        return;
    }
    IKFAST_ASSERT(rawcoeffs[0] != 0);
    const IkReal tol = 128.0*std::numeric_limits<IkReal>::epsilon();
    const IkReal tolsqrt = sqrt(std::numeric_limits<IkReal>::epsilon());
    complex<IkReal> coeffs[4];
    const int maxsteps = 110;
    for(int i = 0; i < 4; ++i) {
        coeffs[i] = complex<IkReal>(rawcoeffs[i+1]/rawcoeffs[0]);
    }
    complex<IkReal> roots[4];
    IkReal err[4];
    roots[0] = complex<IkReal>(1,0);
    roots[1] = complex<IkReal>(0.4,0.9); // any complex number not a root of unity works
    err[0] = 1.0;
    err[1] = 1.0;
    for(int i = 2; i < 4; ++i) {
        roots[i] = roots[i-1]*roots[1];
        err[i] = 1.0;
    }
    for(int step = 0; step < maxsteps; ++step) {
        bool changed = false;
        for(int i = 0; i < 4; ++i) {
            if ( err[i] >= tol ) {
                changed = true;
                // evaluate
                complex<IkReal> x = roots[i] + coeffs[0];
                for(int j = 1; j < 4; ++j) {
                    x = roots[i] * x + coeffs[j];
                }
                for(int j = 0; j < 4; ++j) {
                    if( i != j ) {
                        if( roots[i] != roots[j] ) {
                            x /= (roots[i] - roots[j]);
                        }
                    }
                }
                roots[i] -= x;
                err[i] = abs(x);
            }
        }
        if( !changed ) {
            break;
        }
    }

    numroots = 0;
    bool visited[4] = {false};
    for(int i = 0; i < 4; ++i) {
        if( !visited[i] ) {
            // might be a multiple root, in which case it will have more error than the other roots
            // find any neighboring roots, and take the average
            complex<IkReal> newroot=roots[i];
            int n = 1;
            for(int j = i+1; j < 4; ++j) {
                // care about error in real much more than imaginary
                if( abs(real(roots[i])-real(roots[j])) < tolsqrt && abs(imag(roots[i])-imag(roots[j])) < 0.002 ) {
                    newroot += roots[j];
                    n += 1;
                    visited[j] = true;
                }
            }
            if( n > 1 ) {
                newroot /= n;
            }
            // there are still cases where even the mean is not accurate enough, until a better multi-root algorithm is used, need to use the sqrt
            if( IKabs(imag(newroot)) < tolsqrt ) {
                rawroots[numroots++] = real(newroot);
            }
        }
    }
}